

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O2

void __thiscall
actorpp::ActorThread<PingPong>::ActorThread<actorpp::Channel<int>&>
          (ActorThread<PingPong> *this,Channel<int> *args)

{
  __shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  anon_class_8_1_8991fb9c_for__M_head_impl local_18;
  
  std::__shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,
             (__shared_ptr<actorpp::detail::ChannelImpl<int>,_(__gnu_cxx::_Lock_policy)2> *)args);
  PingPong::PingPong(&this->super_PingPong,(Channel<int> *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  local_18.this = this;
  std::thread::
  thread<actorpp::ActorThread<PingPong>::ActorThread<actorpp::Channel<int>&>(actorpp::Channel<int>&)::_lambda()_1_,,void>
            (&this->thread,&local_18);
  return;
}

Assistant:

ActorThread(Args &&...args)
      : ActorT(std::forward<Args>(args)...), thread([&] { this->run(); }) {}